

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall
fasttext::Dictionary::computeSubwords
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *substrings)

{
  element_type *peVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t n;
  ulong uVar5;
  ulong uVar6;
  Dictionary *this_00;
  string ngram;
  
  for (uVar4 = 0; uVar3 = word->_M_string_length, uVar4 < uVar3; uVar4 = uVar4 + 1) {
    ngram._M_dataplus._M_p = (pointer)&ngram.field_2;
    ngram._M_string_length = 0;
    ngram.field_2._M_local_buf[0] = '\0';
    uVar6 = uVar4;
    for (uVar5 = 1;
        (uVar6 < uVar3 &&
        (uVar5 <= (ulong)(long)((this->args_).
                                super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->maxn)); uVar5 = uVar5 + 1) {
      this_00 = (Dictionary *)&ngram;
      std::__cxx11::string::push_back((char)(Dictionary *)&ngram);
      uVar6 = uVar6 + 1;
      peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((ulong)(long)peVar1->minn <= uVar5) {
        if ((uVar5 != 1) || (uVar4 != 0 && uVar6 != word->_M_string_length)) {
          uVar2 = hash(this_00,&ngram);
          pushHash(this,ngrams,uVar2 % (uint)peVar1->bucket);
          if (substrings !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(substrings,(value_type *)&ngram);
          }
        }
      }
      uVar3 = word->_M_string_length;
    }
    std::__cxx11::string::~string((string *)&ngram);
  }
  return;
}

Assistant:

void Dictionary::computeSubwords(
		const std::string& word,
		std::vector<int32_t>& ngrams,
		std::vector<std::string>* substrings) const {
	for (size_t i = 0; i < word.size(); i++) {
		std::string ngram;
		if ((word[i] & 0xC0) == 0x80) {
			continue;
		}
		for (size_t j = i, n = 1; j < word.size() && n <= args_->maxn; n++) {
			ngram.push_back(word[j++]);
			while (j < word.size() && (word[j] & 0xC0) == 0x80) {
				ngram.push_back(word[j++]);
			}
			if (n >= args_->minn && !(n == 1 && (i == 0 || j == word.size()))) {
				int32_t h = hash(ngram) % args_->bucket;
				pushHash(ngrams, h);
				if (substrings) {
					substrings->push_back(ngram);
				}
			}
		}
	}
}